

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsa_StrDup(PaAlsaHostApiRepresentation *alsaApi,char **dst,char *src)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(src);
  sVar1 = (size_t)((int)sVar1 + 1);
  __dest = (char *)PaUtil_GroupAllocateMemory((PaUtilAllocationGroup *)alsaApi,sVar1);
  *dst = __dest;
  if (__dest != (char *)0x0) {
    strncpy(__dest,src,sVar1);
    return 0;
  }
  PaUtil_DebugPrint(
                   "Expression \'*dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1082\n"
                   );
}

Assistant:

static PaError PaAlsa_StrDup( PaAlsaHostApiRepresentation *alsaApi,
        char **dst,
        const char *src)
{
    PaError result = paNoError;
    int len = strlen( src ) + 1;

    /* PA_DEBUG(("PaStrDup %s %d\n", src, len)); */

    PA_UNLESS( *dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
            paInsufficientMemory );
    strncpy( *dst, src, len );

error:
    return result;
}